

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AtanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_atan(NeuralNetworkLayer *this)

{
  AtanLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x2e4) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2e4;
    this_00 = (AtanLayerParams *)operator_new(0x18);
    AtanLayerParams::AtanLayerParams(this_00);
    (this->layer_).atan_ = this_00;
  }
  return (AtanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanLayerParams* NeuralNetworkLayer::mutable_atan() {
  if (!has_atan()) {
    clear_layer();
    set_has_atan();
    layer_.atan_ = new ::CoreML::Specification::AtanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.atan)
  return layer_.atan_;
}